

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

char * kj::_::fill<kj::String,kj::StringPtr&,kj::String>
                 (char *target,String *first,StringPtr *rest,String *rest_1)

{
  char *pcVar1;
  StringPtr *first_00;
  String *rest_00;
  char *end;
  char *i;
  String *rest_local_1;
  StringPtr *rest_local;
  String *first_local;
  char *target_local;
  
  end = String::begin(first);
  pcVar1 = String::end(first);
  first_local = (String *)target;
  while (end != pcVar1) {
    *(char *)&(first_local->content).ptr = *end;
    end = end + 1;
    first_local = (String *)((long)&(first_local->content).ptr + 1);
  }
  first_00 = fwd<kj::StringPtr&>(rest);
  rest_00 = fwd<kj::String>(rest_1);
  pcVar1 = fill<kj::StringPtr,kj::String>((char *)first_local,first_00,rest_00);
  return pcVar1;
}

Assistant:

char* fill(char* __restrict__ target, const First& first, Rest&&... rest) {
  auto i = first.begin();
  auto end = first.end();
  while (i != end) {
    *target++ = *i++;
  }
  return fill(target, kj::fwd<Rest>(rest)...);
}